

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

uint32 __thiscall crnd::symbol_codec::decode(symbol_codec *this,static_huffman_data_model *model)

{
  decoder_tables *pdVar1;
  byte *pbVar2;
  uint uVar3;
  uint local_64;
  int val_ptr;
  uint32 t;
  uint32 len;
  uint32 sym;
  uint32 k;
  uint32 c_1;
  uint32 c;
  uint8 *p;
  uint32 c1;
  uint32 c0;
  decoder_tables *pTables;
  static_huffman_data_model *model_local;
  symbol_codec *this_local;
  
  pdVar1 = model->m_pDecode_tables;
  if (this->m_bit_count < 0x18) {
    if (this->m_bit_count < 0x10) {
      p._4_4_ = 0;
      p._0_4_ = 0;
      pbVar2 = this->m_pDecode_buf_next;
      _c_1 = pbVar2;
      if (pbVar2 < this->m_pDecode_buf_end) {
        _c_1 = pbVar2 + 1;
        p._4_4_ = (uint)*pbVar2;
      }
      if (_c_1 < this->m_pDecode_buf_end) {
        p._0_4_ = (uint)*_c_1;
        _c_1 = _c_1 + 1;
      }
      this->m_pDecode_buf_next = _c_1;
      this->m_bit_count = this->m_bit_count + 0x10;
      this->m_bit_buf =
           (p._4_4_ << 8 | (uint)p) << (0x20U - (char)this->m_bit_count & 0x1f) | this->m_bit_buf;
    }
    else {
      if (this->m_pDecode_buf_next < this->m_pDecode_buf_end) {
        pbVar2 = this->m_pDecode_buf_next;
        this->m_pDecode_buf_next = pbVar2 + 1;
        local_64 = (uint)*pbVar2;
      }
      else {
        local_64 = 0;
      }
      this->m_bit_count = this->m_bit_count + 8;
      this->m_bit_buf = local_64 << (0x20U - (char)this->m_bit_count & 0x1f) | this->m_bit_buf;
    }
  }
  uVar3 = (this->m_bit_buf >> 0x10) + 1;
  if (pdVar1->m_table_max_code < uVar3) {
    val_ptr = pdVar1->m_decode_start_code_size;
    while (pdVar1->m_max_codes[val_ptr - 1] < uVar3) {
      val_ptr = val_ptr + 1;
    }
    uVar3 = pdVar1->m_val_ptrs[val_ptr - 1] + (this->m_bit_buf >> (0x20U - (char)val_ptr & 0x1f));
    if (model->m_total_syms <= uVar3) {
      return 0;
    }
    t = (uint32)pdVar1->m_sorted_symbol_order[(int)uVar3];
  }
  else {
    t = pdVar1->m_lookup[this->m_bit_buf >> (0x20U - (char)pdVar1->m_table_bits & 0x1f)] & 0xffff;
    val_ptr = pdVar1->m_lookup[this->m_bit_buf >> (0x20U - (char)pdVar1->m_table_bits & 0x1f)] >>
              0x10;
  }
  this->m_bit_buf = this->m_bit_buf << ((byte)val_ptr & 0x1f);
  this->m_bit_count = this->m_bit_count - val_ptr;
  return t;
}

Assistant:

uint32 symbol_codec::decode(const static_huffman_data_model& model)
    {
        const prefix_coding::decoder_tables* pTables = model.m_pDecode_tables;

        if (m_bit_count < 24)
        {
            if (m_bit_count < 16)
            {
                uint32 c0 = 0, c1 = 0;
                const uint8* p = m_pDecode_buf_next;
                if (p < m_pDecode_buf_end)
                    c0 = *p++;
                if (p < m_pDecode_buf_end)
                    c1 = *p++;
                m_pDecode_buf_next = p;
                m_bit_count += 16;
                uint32 c = (c0 << 8) | c1;
                m_bit_buf |= (c << (32 - m_bit_count));
            }
            else
            {
                uint32 c = (m_pDecode_buf_next < m_pDecode_buf_end) ? *m_pDecode_buf_next++ : 0;
                m_bit_count += 8;
                m_bit_buf |= (c << (32 - m_bit_count));
            }
        }

        uint32 k = (m_bit_buf >> 16) + 1;
        uint32 sym, len;

        if (k <= pTables->m_table_max_code)
        {
            uint32 t = pTables->m_lookup[m_bit_buf >> (32 - pTables->m_table_bits)];

            CRND_ASSERT(t != cUINT32_MAX);
            sym = t & cUINT16_MAX;
            len = t >> 16;

            CRND_ASSERT(model.m_code_sizes[sym] == len);
        }
        else
        {
            len = pTables->m_decode_start_code_size;

            for (;;)
            {
                if (k <= pTables->m_max_codes[len - 1])
                    break;
                len++;
            }

            int val_ptr = pTables->m_val_ptrs[len - 1] + (m_bit_buf >> (32 - len));

            if (((uint32)val_ptr >= model.m_total_syms))
            {
                // corrupted stream, or a bug
                CRND_ASSERT(0);
                return 0;
            }

            sym = pTables->m_sorted_symbol_order[val_ptr];
        }

        m_bit_buf <<= len;
        m_bit_count -= len;

        return sym;
    }